

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdKelvinDmaClipid::emulate_mthd(MthdKelvinDmaClipid *this)

{
  pgraph_state *state;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset;
  if (iVar1 < 4) {
    uVar7 = (uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                   super_Test.chipset.gpu == GPU_NV3T) << 0x16 | 0x3fffff;
  }
  else {
    uVar7 = 0xffffff;
    if (iVar1 != 4) {
      iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
              super_Test.chipset.card_type;
      uVar7 = 0x1ffffff;
      if ((0xf < iVar1) && (uVar7 = 0x3fffffff, iVar1 < 0x20)) {
        uVar7 = 0x7ffffff;
      }
    }
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[0];
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.pobj[1];
  uVar6 = uVar2 & 0xfff;
  uVar5 = uVar2 >> 0x10 & 3;
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.pobj[2];
  if (((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000) != 0)
      && (uVar6 != 0x30)) && (uVar6 != 0x3d)) {
    nv04_pgraph_blowup(state,2);
  }
  if ((uVar6 != 0x30) &&
     ((1 < uVar5 || (uVar2 & 0xff00000) != 0) ||
      uVar5 == 1 &&
      0x3f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.card_type)) {
    nv04_pgraph_blowup(state,4);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_clipid =
       (uint)(uVar6 != 0x30) << 0x1f | uVar3 & uVar7 | (uint)(uVar5 == 1) << 0x1e;
  uVar7 = (uVar2 >> 0x14 | uVar4 & 0x3ffff000) & uVar7;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_clipid = uVar7;
  pgraph_bundle(state,0x48,0,uVar7,false);
  pgraph_bundle(state,0x45,0,
                (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                bundle_surf_limit_clipid,true);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t offset_mask = pgraph_offset_mask(&chipset) | 0x3f;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		int mem = extr(pobj[0], 16, 2);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 8))
			prot_err = true;
		if (mem >= 2)
			prot_err = true;
		if (mem == 1 && chipset.card_type >= 0x40)
			prot_err = true;
		if (dcls == 0x30) {
			prot_err = false;
		}
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		if (!exp.nsource) {
			exp.bundle_surf_limit_clipid = (limit & offset_mask) | (mem == 1) << 30 | (dcls != 0x30) << 31;
			exp.bundle_surf_base_clipid = base & offset_mask;
			pgraph_bundle(&exp, BUNDLE_SURF_BASE_CLIPID, 0, exp.bundle_surf_base_clipid, false);
			pgraph_bundle(&exp, BUNDLE_SURF_LIMIT_CLIPID, 0, exp.bundle_surf_limit_clipid, true);
		}
	}